

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O2

size_type __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::erase
          (set<Color,_std::less<Color>_> *this,key_type *key)

{
  byte bVar1;
  byte bVar2;
  reference ref;
  reference local_28;
  
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
  operator[](&local_28,&this->a,*key);
  bVar1 = local_28.parent[local_28.num_index].a._M_elems[0];
  bVar2 = bVar1;
  if ((local_28.bit_index & bVar1) != 0) {
    this->s = this->s - 1;
    bVar2 = local_28.parent[local_28.num_index].a._M_elems[0];
  }
  local_28.parent[local_28.num_index].a._M_elems[0] = ~local_28.bit_index & bVar2;
  return (ulong)((local_28.bit_index & bVar1) != 0);
}

Assistant:

constexpr size_type erase(const key_type& key) noexcept {
    typename container_type::reference ref = a[key];
    bool res = ref;
    if (res) {
      --s;
    }
    ref = false;
    return res;
  }